

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyBroadcastReceiver.h
# Opt level: O1

int __thiscall
aeron::concurrent::broadcast::CopyBroadcastReceiver::receive
          (CopyBroadcastReceiver *this,handler_t *handler)

{
  int iVar1;
  int iVar2;
  int index;
  AtomicBuffer *pAVar3;
  BroadcastReceiver *pBVar4;
  bool bVar5;
  long *plVar6;
  SourcedException *pSVar7;
  char *pcVar8;
  size_type *psVar9;
  long lVar10;
  int iVar11;
  uint64_t length;
  allocator local_119;
  string local_118;
  string local_f8;
  string local_d8;
  handler_t *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lVar10 = (this->m_receiver->m_lappedCount).super___atomic_base<long>._M_i;
  bVar5 = BroadcastReceiver::receiveNext(this->m_receiver);
  iVar11 = 0;
  if (bVar5) {
    if (lVar10 != (this->m_receiver->m_lappedCount).super___atomic_base<long>._M_i) {
      pSVar7 = (SourcedException *)__cxa_allocate_exception(0x48);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"unable to keep up with broadcast buffer","");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,"");
      pcVar8 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
                                );
      std::__cxx11::string::string((string *)&local_d8,pcVar8,(allocator *)&local_b0);
      util::SourcedException::SourcedException(pSVar7,&local_f8,&local_118,&local_d8,0x35);
      *(undefined ***)pSVar7 = &PTR__SourcedException_00163a98;
      __cxa_throw(pSVar7,&util::IllegalArgumentException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    pAVar3 = this->m_receiver->m_buffer;
    iVar11 = this->m_receiver->m_recordOffset;
    local_b8 = handler;
    AtomicBuffer::boundsCheck(pAVar3,iVar11,4);
    length = (long)*(int *)(pAVar3->m_buffer + iVar11) - 8;
    iVar11 = (int)length;
    if ((int)(this->m_scratchBuffer).m_length < iVar11) {
      pSVar7 = (SourcedException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_b0,iVar11);
      std::operator+(&local_d8,"buffer required size ",&local_b0);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_118._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_118._M_dataplus._M_p == psVar9) {
        local_118.field_2._M_allocated_capacity = *psVar9;
        local_118.field_2._8_8_ = plVar6[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar9;
      }
      local_118._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::to_string(&local_50,(this->m_scratchBuffer).m_length);
      std::operator+(&local_f8,&local_118,&local_50);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,"");
      pcVar8 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
                                );
      std::__cxx11::string::string((string *)&local_70,pcVar8,&local_119);
      util::SourcedException::SourcedException(pSVar7,&local_f8,&local_90,&local_70,0x3d);
      *(undefined ***)pSVar7 = &PTR__SourcedException_00164480;
      __cxa_throw(pSVar7,&util::IllegalStateException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    pAVar3 = this->m_receiver->m_buffer;
    iVar1 = this->m_receiver->m_recordOffset;
    AtomicBuffer::boundsCheck(pAVar3,iVar1 + 4,4);
    iVar1 = *(int *)(pAVar3->m_buffer + (long)iVar1 + 4);
    pAVar3 = this->m_receiver->m_buffer;
    lVar10 = (long)this->m_receiver->m_recordOffset + 8;
    AtomicBuffer::boundsCheck(&this->m_scratchBuffer,0,length);
    AtomicBuffer::boundsCheck(pAVar3,(index_t)lVar10,length);
    memcpy((this->m_scratchBuffer).m_buffer,pAVar3->m_buffer + lVar10,length);
    pBVar4 = this->m_receiver;
    iVar2 = pBVar4->m_capacity;
    lVar10 = pBVar4->m_cursor;
    pAVar3 = pBVar4->m_buffer;
    index = pBVar4->m_tailIntentCounterIndex;
    AtomicBuffer::boundsCheck(pAVar3,index,8);
    if (iVar2 + lVar10 <= *(long *)(pAVar3->m_buffer + index)) {
      pSVar7 = (SourcedException *)__cxa_allocate_exception(0x48);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"unable to keep up with broadcast buffer","");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,"");
      pcVar8 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
                                );
      std::__cxx11::string::string((string *)&local_d8,pcVar8,(allocator *)&local_b0);
      util::SourcedException::SourcedException(pSVar7,&local_f8,&local_118,&local_d8,0x45);
      *(undefined ***)pSVar7 = &PTR__SourcedException_00164480;
      __cxa_throw(pSVar7,&util::IllegalStateException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    std::function<void_(int,_aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
              (local_b8,iVar1,&this->m_scratchBuffer,0,iVar11);
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

int receive(const handler_t& handler)
    {
        int messagesReceived = 0;
        const long lastSeenLappedCount = m_receiver.lappedCount();

        if (m_receiver.receiveNext())
        {
            if (lastSeenLappedCount != m_receiver.lappedCount())
            {
                throw util::IllegalArgumentException("unable to keep up with broadcast buffer", SOURCEINFO);
            }

            const std::int32_t length = m_receiver.length();
            if (length > m_scratchBuffer.capacity())
            {
                throw util::IllegalStateException(
                    "buffer required size " + std::to_string(length) +
                    " but only has " + std::to_string(m_scratchBuffer.capacity()), SOURCEINFO);
            }

            const std::int32_t msgTypeId = m_receiver.typeId();
            m_scratchBuffer.putBytes(0, m_receiver.buffer(), m_receiver.offset(), length);

            if (!m_receiver.validate())
            {
                throw util::IllegalStateException("unable to keep up with broadcast buffer", SOURCEINFO);
            }

            handler(msgTypeId, m_scratchBuffer, 0, length);

            messagesReceived = 1;
        }

        return messagesReceived;
    }